

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory64Lowering.cpp
# Opt level: O3

void __thiscall
wasm::Memory64Lowering::wrapAddress64(Memory64Lowering *this,Expression **ptr,Name memoryName)

{
  Module *this_00;
  Expression *pEVar1;
  Memory *pMVar2;
  Unary *this_01;
  
  if (((*ptr)->type).id != 1) {
    this_00 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>
              .super_Walker<wasm::Memory64Lowering,_wasm::Visitor<wasm::Memory64Lowering,_void>_>.
              currModule;
    pMVar2 = Module::getMemory(this_00,memoryName);
    if ((pMVar2->indexType).id == 3) {
      pEVar1 = *ptr;
      if ((pEVar1->type).id != 3) {
        __assert_fail("ptr->type == Type::i64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Memory64Lowering.cpp"
                      ,0x2b,"void wasm::Memory64Lowering::wrapAddress64(Expression *&, Name)");
      }
      this_01 = (Unary *)MixedArena::allocSpace(&this_00->allocator,0x20,8);
      (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
      (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
      this_01->op = WrapInt64;
      this_01->value = pEVar1;
      Unary::finalize(this_01);
      *ptr = (Expression *)this_01;
    }
  }
  return;
}

Assistant:

void wrapAddress64(Expression*& ptr, Name memoryName) {
    if (ptr->type == Type::unreachable) {
      return;
    }
    auto& module = *getModule();
    auto memory = module.getMemory(memoryName);
    if (memory->is64()) {
      assert(ptr->type == Type::i64);
      Builder builder(module);
      ptr = builder.makeUnary(UnaryOp::WrapInt64, ptr);
    }
  }